

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::CodeSinkingPass::SinkInstruction(CodeSinkingPass *this,Instruction *inst)

{
  Instruction *pIVar1;
  IRContext *pIVar2;
  bool bVar3;
  BasicBlock *pBVar4;
  Instruction *pIVar5;
  mapped_type *ppBVar6;
  Instruction *pIVar7;
  Instruction *local_20;
  
  if ((((inst->opcode_ != OpAccessChain) && (inst->opcode_ != OpLoad)) ||
      (bVar3 = ReferencesMutableMemory(this,inst), bVar3)) ||
     (pBVar4 = FindNewBasicBlockFor(this,inst), pBVar4 == (BasicBlock *)0x0)) {
    return false;
  }
  pIVar5 = (pBVar4->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar5->opcode_ == OpPhi) {
    do {
      pIVar5 = (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      pIVar7 = pIVar5;
      if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar7 = (Instruction *)0x0;
      }
    } while (pIVar7->opcode_ == OpPhi);
  }
  if ((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != true) {
    if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ !=
        (Instruction *)0x0) {
      pIVar7 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar7 != (Instruction *)0x0) {
        pIVar1 = (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar1;
        (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar7;
        (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             (Instruction *)0x0;
      }
      (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar5;
      (inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = inst;
      (((inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = inst;
      pIVar2 = (this->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        local_20 = inst;
        ppBVar6 = std::__detail::
                  _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&pIVar2->instr_to_block_,&local_20);
        *ppBVar6 = pBVar4;
      }
      return true;
    }
    __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xaf,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                 );
  }
  __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                ,0xae,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

bool CodeSinkingPass::SinkInstruction(Instruction* inst) {
  if (inst->opcode() != spv::Op::OpLoad &&
      inst->opcode() != spv::Op::OpAccessChain) {
    return false;
  }

  if (ReferencesMutableMemory(inst)) {
    return false;
  }

  if (BasicBlock* target_bb = FindNewBasicBlockFor(inst)) {
    Instruction* pos = &*target_bb->begin();
    while (pos->opcode() == spv::Op::OpPhi) {
      pos = pos->NextNode();
    }

    inst->InsertBefore(pos);
    context()->set_instr_block(inst, target_bb);
    return true;
  }
  return false;
}